

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureFilteringTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::TextureCubeArrayFilteringCase::~TextureCubeArrayFilteringCase
          (TextureCubeArrayFilteringCase *this)

{
  TextureCubeArrayFilteringCase *this_local;
  
  ~TextureCubeArrayFilteringCase(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

TextureCubeArrayFilteringCase::~TextureCubeArrayFilteringCase (void)
{
	TextureCubeArrayFilteringCase::deinit();
}